

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O0

int32_t advanceUntil(uint16_t *array,int32_t pos,int32_t length,uint16_t min)

{
  bool bVar1;
  int32_t iVar2;
  int iVar3;
  int local_34;
  int32_t mid;
  int32_t upper;
  int32_t spansize;
  int32_t lower;
  uint16_t min_local;
  int32_t length_local;
  int32_t pos_local;
  uint16_t *array_local;
  int local_4;
  
  iVar3 = pos + 1;
  local_4 = iVar3;
  if ((iVar3 < length) && (array[iVar3] < min)) {
    spansize = 1;
    while( true ) {
      bVar1 = false;
      if (iVar3 + spansize < length) {
        bVar1 = array[iVar3 + spansize] < min;
      }
      if (!bVar1) break;
      spansize = spansize << 1;
    }
    if (iVar3 + spansize < length) {
      local_34 = iVar3 + spansize;
    }
    else {
      local_34 = length + -1;
    }
    upper = local_34;
    if (array[local_34] == min) {
      local_4 = local_34;
    }
    else {
      local_4 = length;
      if (min <= array[local_34]) {
        iVar2 = upper;
        lower = (spansize >> 1) + iVar3;
        while (upper = iVar2, lower + 1 != upper) {
          iVar3 = lower + upper >> 1;
          if (array[iVar3] == min) {
            return iVar3;
          }
          iVar2 = iVar3;
          if (array[iVar3] < min) {
            iVar2 = upper;
            lower = iVar3;
          }
        }
        local_4 = upper;
      }
    }
  }
  return local_4;
}

Assistant:

static inline int32_t advanceUntil(const uint16_t *array, int32_t pos,
                                   int32_t length, uint16_t min) {
    int32_t lower = pos + 1;

    if ((lower >= length) || (array[lower] >= min)) {
        return lower;
    }

    int32_t spansize = 1;

    while ((lower + spansize < length) && (array[lower + spansize] < min)) {
        spansize <<= 1;
    }
    int32_t upper = (lower + spansize < length) ? lower + spansize : length - 1;

    if (array[upper] == min) {
        return upper;
    }
    if (array[upper] < min) {
        // means
        // array
        // has no
        // item
        // >= min
        // pos = array.length;
        return length;
    }

    // we know that the next-smallest span was too small
    lower += (spansize >> 1);

    int32_t mid = 0;
    while (lower + 1 != upper) {
        mid = (lower + upper) >> 1;
        if (array[mid] == min) {
            return mid;
        } else if (array[mid] < min) {
            lower = mid;
        } else {
            upper = mid;
        }
    }
    return upper;
}